

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pageInsertArray(MemPage *pPg,u8 *pBegin,u8 **ppData,u8 *pCellptr,int iFirst,int nCell,
                   CellArray *pCArray)

{
  u16 uVar1;
  u8 *local_68;
  u8 *pSlot;
  uint local_58;
  int rc;
  int sz;
  int iEnd;
  u8 *pData;
  u8 *aData;
  int local_38;
  int i;
  int nCell_local;
  int iFirst_local;
  u8 *pCellptr_local;
  u8 **ppData_local;
  u8 *pBegin_local;
  MemPage *pPg_local;
  
  pData = pPg->aData;
  _sz = *ppData;
  rc = iFirst + nCell;
  aData._4_4_ = iFirst;
  local_38 = nCell;
  i = iFirst;
  _nCell_local = pCellptr;
  pCellptr_local = (u8 *)ppData;
  ppData_local = (u8 **)pBegin;
  pBegin_local = &pPg->isInit;
  do {
    if (rc <= aData._4_4_) {
      *(u8 **)pCellptr_local = _sz;
      return 0;
    }
    uVar1 = cachedCellSize(pCArray,aData._4_4_);
    local_58 = (uint)uVar1;
    if (((pData[1] == '\0') && (pData[2] == '\0')) ||
       (local_68 = pageFindSlot((MemPage *)pBegin_local,local_58,(int *)((long)&pSlot + 4)),
       local_68 == (u8 *)0x0)) {
      if ((long)_sz - (long)ppData_local < (long)(int)local_58) {
        return 1;
      }
      local_68 = _sz + -(long)(int)local_58;
      _sz = local_68;
    }
    memmove(local_68,pCArray->apCell[aData._4_4_],(long)(int)local_58);
    *_nCell_local = (u8)((ulong)((long)local_68 - (long)pData) >> 8);
    _nCell_local[1] = (char)local_68 - (char)pData;
    _nCell_local = _nCell_local + 2;
    aData._4_4_ = aData._4_4_ + 1;
  } while( true );
}

Assistant:

static int pageInsertArray(
  MemPage *pPg,                   /* Page to add cells to */
  u8 *pBegin,                     /* End of cell-pointer array */
  u8 **ppData,                    /* IN/OUT: Page content -area pointer */
  u8 *pCellptr,                   /* Pointer to cell-pointer area */
  int iFirst,                     /* Index of first cell to add */
  int nCell,                      /* Number of cells to add to pPg */
  CellArray *pCArray              /* Array of cells */
){
  int i;
  u8 *aData = pPg->aData;
  u8 *pData = *ppData;
  int iEnd = iFirst + nCell;
  assert( CORRUPT_DB || pPg->hdrOffset==0 );    /* Never called on page 1 */
  for(i=iFirst; i<iEnd; i++){
    int sz, rc;
    u8 *pSlot;
    sz = cachedCellSize(pCArray, i);
    if( (aData[1]==0 && aData[2]==0) || (pSlot = pageFindSlot(pPg,sz,&rc))==0 ){
      if( (pData - pBegin)<sz ) return 1;
      pData -= sz;
      pSlot = pData;
    }
    /* pSlot and pCArray->apCell[i] will never overlap on a well-formed
    ** database.  But they might for a corrupt database.  Hence use memmove()
    ** since memcpy() sends SIGABORT with overlapping buffers on OpenBSD */
    assert( (pSlot+sz)<=pCArray->apCell[i]
         || pSlot>=(pCArray->apCell[i]+sz)
         || CORRUPT_DB );
    memmove(pSlot, pCArray->apCell[i], sz);
    put2byte(pCellptr, (pSlot - aData));
    pCellptr += 2;
  }
  *ppData = pData;
  return 0;
}